

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syms.c
# Opt level: O2

void write_syms(void)

{
  sym_t *psVar1;
  sym_t **ppsVar2;
  symbol_entry_t sym;
  block_header_t header;
  symbol_entry_t local_50;
  
  if (num_syms != 0) {
    header.type = symbols;
    header.num_entries = num_syms;
    write_block_header(&header);
    ppsVar2 = &root;
    while( true ) {
      psVar1 = *ppsVar2;
      if (psVar1 == (sym_t *)0x0) break;
      local_50.sym_id = psVar1->sym_id;
      cur = psVar1;
      strncpy((char *)local_50.id,psVar1->id,0x20);
      local_50.section_id = psVar1->section_id;
      local_50.offset = psVar1->offset;
      local_50.type = psVar1->type;
      write_symbol_entry(&local_50);
      ppsVar2 = &cur->next;
    }
    cur = (sym_t *)0x0;
  }
  return;
}

Assistant:

void write_syms()
{
    block_header_t header;
    symbol_entry_t sym;
    if (num_syms == 0)
        return;

    header.type = symbols;
    header.num_entries = num_syms;
    write_block_header(&header);
    cur = root;
    while (cur)
    {
        sym.sym_id = cur->sym_id;
        strncpy((char*)sym.id, cur->id, MAX_ID_LEN + 1);
        sym.section_id = cur->section_id;
        sym.offset = cur->offset;
        sym.type = cur->type;
        write_symbol_entry(&sym);
        cur = cur->next;
    }
}